

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

int perfetto::base::anon_unknown_0::GetSockFamily(SockFamily family)

{
  uint __errnum;
  code *pcVar1;
  char *fname;
  uint *puVar2;
  char *pcVar3;
  
  if (family - kUnix < 3) {
    return *(int *)(&DAT_00382910 + (ulong)(family - kUnix) * 4);
  }
  fname = Basename(
                  "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                  );
  puVar2 = (uint *)__errno_location();
  __errnum = *puVar2;
  pcVar3 = strerror(__errnum);
  LogMessage(kLogError,fname,0x106b0,"%s (errno: %d, %s)","PERFETTO_CHECK(false)",(ulong)__errnum,
             pcVar3);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

inline int GetSockFamily(SockFamily family) {
  switch (family) {
    case SockFamily::kUnix:
      return AF_UNIX;
    case SockFamily::kInet:
      return AF_INET;
    case SockFamily::kInet6:
      return AF_INET6;
  }
  PERFETTO_CHECK(false);  // For GCC.
}